

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_d2.cc
# Opt level: O0

int X509_STORE_load_locations(X509_STORE *ctx,char *file,char *dir)

{
  int iVar1;
  X509_LOOKUP_METHOD *pXVar2;
  X509_LOOKUP *pXVar3;
  X509_LOOKUP *lookup;
  char *path_local;
  char *file_local;
  X509_STORE *ctx_local;
  
  if (file != (char *)0x0) {
    pXVar2 = X509_LOOKUP_file();
    pXVar3 = X509_STORE_add_lookup(ctx,pXVar2);
    if (pXVar3 == (X509_LOOKUP *)0x0) {
      return 0;
    }
    iVar1 = X509_LOOKUP_load_file((X509_LOOKUP *)pXVar3,file,1);
    if (iVar1 != 1) {
      return 0;
    }
  }
  if (dir != (char *)0x0) {
    pXVar2 = X509_LOOKUP_hash_dir();
    pXVar3 = X509_STORE_add_lookup(ctx,pXVar2);
    if (pXVar3 == (X509_LOOKUP *)0x0) {
      return 0;
    }
    iVar1 = X509_LOOKUP_add_dir((X509_LOOKUP *)pXVar3,dir,1);
    if (iVar1 != 1) {
      return 0;
    }
  }
  if ((dir == (char *)0x0) && (file == (char *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int X509_STORE_load_locations(X509_STORE *ctx, const char *file,
                              const char *path) {
  X509_LOOKUP *lookup;

  if (file != NULL) {
    lookup = X509_STORE_add_lookup(ctx, X509_LOOKUP_file());
    if (lookup == NULL) {
      return 0;
    }
    if (X509_LOOKUP_load_file(lookup, file, X509_FILETYPE_PEM) != 1) {
      return 0;
    }
  }
  if (path != NULL) {
    lookup = X509_STORE_add_lookup(ctx, X509_LOOKUP_hash_dir());
    if (lookup == NULL) {
      return 0;
    }
    if (X509_LOOKUP_add_dir(lookup, path, X509_FILETYPE_PEM) != 1) {
      return 0;
    }
  }
  if ((path == NULL) && (file == NULL)) {
    return 0;
  }
  return 1;
}